

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void __thiscall zsummer::log4z::LoggerInfo::LoggerInfo(LoggerInfo *this)

{
  LoggerInfo *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_pid);
  std::__cxx11::string::string((string *)&this->_path);
  CLog4zFile::CLog4zFile(&this->_handle);
  SetDefaultInfo(this);
  this->_curFileCreateTime = 0;
  this->_curFileIndex = 0;
  this->_curWriteLen = 0;
  return;
}

Assistant:

LoggerInfo()
	{
		SetDefaultInfo();
		_curFileCreateTime = 0;
		_curFileIndex = 0;
		_curWriteLen = 0;
	}